

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_24::BinaryReader::ReadSections(BinaryReader *this)

{
  Result RVar1;
  BinarySectionOrder BVar2;
  BinarySectionOrder BVar3;
  int iVar4;
  Enum EVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *format;
  char *pcVar8;
  ulong uVar9;
  uint32_t reloc_type;
  uint32_t alignment_log2;
  uint32_t linking_type;
  uint32_t value;
  uint32_t kind;
  uint32_t flags;
  uint32_t version;
  Index num_data_segments;
  uint32_t offset;
  undefined4 local_88;
  uint32_t size;
  TypeVector *local_78;
  TypeVector *local_70;
  Index *local_68;
  size_t local_60;
  uint32_t section_code;
  Index *local_50;
  bool seen_section_code [14];
  
  seen_section_code[8] = false;
  seen_section_code[9] = false;
  seen_section_code[10] = false;
  seen_section_code[0xb] = false;
  seen_section_code[0xc] = false;
  seen_section_code[0xd] = false;
  seen_section_code[0] = false;
  seen_section_code[1] = false;
  seen_section_code[2] = false;
  seen_section_code[3] = false;
  seen_section_code[4] = false;
  seen_section_code[5] = false;
  seen_section_code[6] = false;
  seen_section_code[7] = false;
  if ((this->state_).size <= (this->state_).offset) {
    return (Result)Ok;
  }
  local_50 = &this->num_function_bodies_;
  local_68 = &this->num_function_signatures_;
  local_70 = &this->param_types_;
  local_78 = &this->result_types_;
  uVar7 = 0;
  RVar1 = ReadU32Leb128(this,&section_code,"section code");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = ReadU32Leb128(this,&value,"section size");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  local_60 = this->read_end_;
  uVar6 = (this->state_).offset + (ulong)value;
  this->read_end_ = uVar6;
  uVar9 = (ulong)section_code;
  if (0xd < uVar9) {
    PrintError(this,"invalid section code: %u",uVar9);
    goto LAB_00189497;
  }
  if (section_code == 0) {
LAB_001864f5:
    if ((this->state_).size < uVar6) {
      pcVar8 = "invalid section size: extends past end";
    }
    else {
      if ((section_code != 0) && (this->last_known_section_ != Invalid)) {
        BVar2 = GetSectionOrder(section_code);
        BVar3 = GetSectionOrder(this->last_known_section_);
        if ((int)BVar2 <= (int)BVar3) {
          pcVar8 = GetSectionName(section_code);
          format = "section %s out of order";
          goto LAB_0018948a;
        }
      }
      if ((section_code != 0) && (this->did_read_names_section_ != false)) {
        pcVar8 = GetSectionName(section_code);
        format = "%s section can not occur after Name section";
        goto LAB_0018948a;
      }
      iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                        (this->delegate_,0,uVar9,(ulong)value);
      if (iVar4 == 0) {
        local_88 = (undefined4)
                   CONCAT71((int7)((ulong)uVar7 >> 8),this->options_->stop_on_first_error);
        EVar5 = (*(code *)(&DAT_0019ae10 + *(int *)(&DAT_0019ae10 + uVar9 * 4)))();
        return (Result)EVar5;
      }
      pcVar8 = "BeginSection callback failed";
    }
    PrintError(this,pcVar8);
  }
  else {
    if (seen_section_code[uVar9] != true) {
      seen_section_code[uVar9] = true;
      goto LAB_001864f5;
    }
    pcVar8 = GetSectionName(section_code);
    format = "multiple %s sections";
LAB_0018948a:
    PrintError(this,format,pcVar8);
  }
LAB_00189497:
  this->read_end_ = local_60;
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadSections() {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint32_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU32Leb128(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      return Result::Error;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Event:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadEventSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }


    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}